

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Formatter *format)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  FieldGenerator *pFVar3;
  Printer *pPVar4;
  Hex local_a0;
  allocator local_89;
  string local_88;
  int local_68 [5];
  allocator local_51;
  string local_50;
  int local_2c;
  Formatter *pFStack_28;
  int has_bit_index;
  Formatter *format_local;
  FieldDescriptor *pFStack_18;
  bool is_inline_local;
  FieldDescriptor *field_local;
  MessageGenerator *this_local;
  
  pFStack_28 = format;
  format_local._7_1_ = is_inline;
  pFStack_18 = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = IsFieldStripped(field,&this->options_);
  if (bVar1) {
    Formatter::operator()<>(format,"void $classname$::clear_$name$() { __builtin_trap(); }\n");
  }
  else {
    if ((format_local._7_1_ & 1) != 0) {
      Formatter::operator()<>(format,"inline ");
    }
    Formatter::operator()<>(format,"void $classname$::clear_$name$() {\n");
    Formatter::Indent(format);
    pOVar2 = FieldDescriptor::real_containing_oneof(pFStack_18);
    if (pOVar2 == (OneofDescriptor *)0x0) {
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,pFStack_18);
      pPVar4 = Formatter::printer(format);
      (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,pPVar4);
      bVar1 = HasHasbit(pFStack_18);
      if (bVar1) {
        local_2c = HasBitIndex(this,pFStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_50,"has_array_index",&local_51);
        local_68[0] = local_2c;
        if (local_2c < 0) {
          local_68[0] = local_2c + 0x1f;
        }
        local_68[0] = local_68[0] >> 5;
        Formatter::Set<int>(format,&local_50,local_68);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,"has_mask",&local_89);
        strings::Hex::Hex<unsigned_int>(&local_a0,1 << ((byte)local_2c & 0x1f),ZERO_PAD_8);
        Formatter::Set<google::protobuf::strings::Hex>(format,&local_88,&local_a0);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        Formatter::operator()<>(format,"_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n");
      }
    }
    else {
      Formatter::operator()<>(format,"if (_internal_has_$name$()) {\n");
      Formatter::Indent(format);
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,pFStack_18);
      pPVar4 = Formatter::printer(format);
      (*pFVar3->_vptr_FieldGenerator[10])(pFVar3,pPVar4);
      Formatter::operator()<>(format,"clear_has_$oneof_name$();\n");
      Formatter::Outdent(format);
      Formatter::operator()<>(format,"}\n");
    }
    Formatter::operator()<>(format,"$annotate_clear$");
    Formatter::Outdent(format);
    Formatter::operator()<>(format,"}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format("void $classname$::clear_$name$() { __builtin_trap(); }\n");
    return;
  }

  // Generate clear_$name$().
  if (is_inline) {
    format("inline ");
  }
  format("void $classname$::clear_$name$() {\n");

  format.Indent();

  if (field->real_containing_oneof()) {
    // Clear this field only if it is the active field in this oneof,
    // otherwise ignore
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    field_generators_.get(field).GenerateClearingCode(format.printer());
    format("clear_has_$oneof_name$();\n");
    format.Outdent();
    format("}\n");
  } else {
    field_generators_.get(field).GenerateClearingCode(format.printer());
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      format.Set("has_array_index", has_bit_index / 32);
      format.Set("has_mask",
                 strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
      format("_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n");
    }
  }
  format("$annotate_clear$");
  format.Outdent();
  format("}\n");
}